

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O3

void __thiscall
COLLADASaxFWL::KinematicsModel::addBaseLink(KinematicsModel *this,KinematicLink *baseLink)

{
  pointer *pppKVar1;
  iterator __position;
  KinematicLink *local_8;
  
  __position._M_current =
       (this->mBaseLinks).
       super__Vector_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->mBaseLinks).
      super__Vector_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = baseLink;
    std::vector<COLLADASaxFWL::KinematicLink*,std::allocator<COLLADASaxFWL::KinematicLink*>>::
    _M_realloc_insert<COLLADASaxFWL::KinematicLink*const&>
              ((vector<COLLADASaxFWL::KinematicLink*,std::allocator<COLLADASaxFWL::KinematicLink*>>
                *)&this->mBaseLinks,__position,&local_8);
  }
  else {
    *__position._M_current = baseLink;
    pppKVar1 = &(this->mBaseLinks).
                super__Vector_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppKVar1 = *pppKVar1 + 1;
  }
  return;
}

Assistant:

void addBaseLink( KinematicLink* baseLink ) { mBaseLinks.push_back(baseLink); }